

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

ChebyshevExpansion *
ChebTools::ChebyshevExpansion::from_powxn
          (ChebyshevExpansion *__return_storage_ptr__,size_t n,double xmin,double xmax)

{
  double *pdVar1;
  invalid_argument *this;
  ulong uVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar7;
  VectorXd c;
  vectype local_98;
  undefined1 local_88 [16];
  ChebyshevExpansion local_70;
  undefined1 auVar6 [16];
  
  if ((xmin != -1.0) || (NAN(xmin))) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"xmin must be -1");
  }
  else {
    if ((xmax == 1.0) && (!NAN(xmax))) {
      local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(n + 1);
      local_70.m_xmin = 0.0;
      if ((long)local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_98,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_70);
      pdVar1 = local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      uVar2 = n >> 1;
      auVar6._8_4_ = (int)(n >> 0x20);
      auVar6._0_8_ = n;
      auVar6._12_4_ = 0x45300000;
      iVar4 = (int)n;
      dVar7 = auVar6._8_8_ - 1.9342813113834067e+25;
      local_88._8_4_ = SUB84(dVar7,0);
      local_88._0_8_ = dVar7 + ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0);
      local_88._12_4_ = (int)((ulong)dVar7 >> 0x20);
      lVar3 = 0;
      do {
        if (((long)n < 0) ||
           (local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            <= (long)n)) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        dVar5 = binomialCoefficient((double)local_88._0_8_,(double)lVar3);
        dVar7 = dVar5 * 0.5;
        if (n != 0) {
          dVar7 = dVar5;
        }
        pdVar1[n] = dVar7;
        lVar3 = lVar3 + 1;
        n = n - 2;
      } while (uVar2 + 1 != lVar3);
      dVar7 = ldexp(1.0,1 - iVar4);
      local_88._0_8_ = dVar7;
      ChebyshevExpansion(&local_70,&local_98,-1.0,1.0);
      ChebTools::operator*(__return_storage_ptr__,(double)local_88._0_8_,&local_70);
      free(local_70.m_nodal_value_cache.
           super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(local_70.m_recurrence_buffer.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      free(local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      return __return_storage_ptr__;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"xmax must be 1");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::from_powxn(const std::size_t n, const double xmin, const double xmax) {
        if (xmin != -1) {
            throw std::invalid_argument("xmin must be -1");
        }
        if (xmax != 1) {
            throw std::invalid_argument("xmax must be 1");
        }
        Eigen::VectorXd c = Eigen::VectorXd::Zero(n + 1);
        for (std::size_t k = 0; k <= n / 2; ++k) {
            std::size_t index = n - 2 * k;
            double coeff = binomialCoefficient(static_cast<double>(n), static_cast<double>(k));
            if (index == 0) {
                coeff /= 2.0;
            }
            c(index) = coeff;
        }
        return pow(2, 1-static_cast<int>(n))*ChebyshevExpansion(c, xmin, xmax);
    }